

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O2

void update_txfm_count(MACROBLOCK *x,MACROBLOCKD *xd,FRAME_COUNTS *counts,TX_SIZE tx_size,int depth,
                      int blk_row,int blk_col,uint8_t allow_update_cdf)

{
  uint *puVar1;
  BLOCK_SIZE bsize;
  int iVar2;
  MB_MODE_INFO *pMVar3;
  TX_SIZE txb_size;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  undefined7 in_register_00000009;
  int iVar8;
  int plane;
  long lVar9;
  TXFM_CONTEXT *pTVar10;
  TXFM_CONTEXT *pTVar11;
  byte bVar12;
  byte bVar13;
  TX_SIZE TVar14;
  ulong uVar15;
  int col;
  int iVar16;
  uint8_t in_stack_ffffffffffffff80;
  int offsetr;
  
  iVar8 = (int)counts;
  txb_size = (TX_SIZE)counts;
  pMVar3 = *xd->mi;
  bsize = pMVar3->bsize;
  iVar4 = max_block_high(xd,bsize,iVar8);
  iVar5 = max_block_wide(xd,bsize,plane);
  pTVar11 = xd->above_txfm_context;
  pTVar10 = xd->left_txfm_context;
  uVar15 = (ulong)counts & 0xffffffff;
  if (iVar8 == 0) {
    lVar9 = 0;
    goto LAB_001d1aae;
  }
  bVar12 = block_size_high[bsize];
  if (block_size_high[bsize] < block_size_wide[bsize]) {
    bVar12 = block_size_wide[bsize];
  }
  if (bVar12 == 8) {
    TVar14 = '\x01';
    bVar13 = 0;
LAB_001d1a80:
    uVar6 = (ulong)(byte)(((""[uVar15] != TVar14 & bVar13) + TVar14 * -2) * '\x03' + 0x18);
  }
  else {
    bVar13 = 1;
    if (bVar12 == 0x10) {
      TVar14 = '\x02';
      goto LAB_001d1a80;
    }
    TVar14 = '\x04';
    if ((bVar12 == 0x80) || (bVar12 == 0x40)) goto LAB_001d1a80;
    if (bVar12 == 0x20) {
      TVar14 = '\x03';
      goto LAB_001d1a80;
    }
    uVar6 = 0x3f;
  }
  lVar9 = (ulong)(pTVar10[depth] < *(byte *)((long)tx_size_high + (ulong)(uint)(iVar8 * 4))) +
          (ulong)(pTVar11[blk_row] < *(byte *)((long)tx_size_wide + (ulong)(uint)(iVar8 * 4))) +
          uVar6;
LAB_001d1aae:
  if ((iVar4 <= depth) || (iVar5 <= blk_row)) {
    return;
  }
  TVar14 = txb_size;
  if ((int)CONCAT71(in_register_00000009,tx_size) == 2) {
    pMVar3->tx_size = txb_size;
  }
  else {
    iVar4 = (blk_row >> (av1_get_txb_size_index_tw_w_log2_table[bsize] & 0x1f)) +
            ((depth >> (av1_get_txb_size_index_tw_h_log2_table[bsize] & 0x1f)) <<
            (av1_get_txb_size_index_stride_log2_table[bsize] & 0x1f));
    if (pMVar3->inter_tx_size[iVar4] == txb_size) {
      if ((char)blk_col != '\0') {
        update_cdf(xd->tile_ctx->txfm_partition_cdf[lVar9],'\0',2);
        pTVar11 = xd->above_txfm_context;
        pTVar10 = xd->left_txfm_context;
      }
      pMVar3->tx_size = txb_size;
    }
    else {
      bVar12 = ""[uVar15];
      uVar6 = (ulong)((uint)bVar12 * 4);
      iVar5 = *(int *)((long)tx_size_wide_unit + uVar6);
      iVar8 = *(int *)((long)tx_size_high_unit + uVar6);
      if ((char)blk_col != '\0') {
        update_cdf(xd->tile_ctx->txfm_partition_cdf[lVar9],'\x01',2);
      }
      puVar1 = &(x->txfm_search_info).txb_split_count;
      *puVar1 = *puVar1 + 1;
      if ((99UL >> ((ulong)counts & 0x3f) & 1) == 0) {
        iVar4 = tx_size_high_unit[uVar15];
        for (iVar7 = 0; iVar7 < iVar4; iVar7 = iVar7 + iVar8) {
          iVar2 = tx_size_wide_unit[uVar15];
          for (iVar16 = 0; iVar16 < iVar2; iVar16 = iVar16 + iVar5) {
            update_txfm_count(x,xd,(FRAME_COUNTS *)(ulong)bVar12,tx_size + '\x01',iVar7 + depth,
                              blk_row + iVar16,blk_col & 0xff,in_stack_ffffffffffffff80);
          }
        }
        return;
      }
      pMVar3->inter_tx_size[iVar4] = '\0';
      pMVar3->tx_size = '\0';
      pTVar11 = xd->above_txfm_context;
      pTVar10 = xd->left_txfm_context;
      TVar14 = '\0';
    }
  }
  txfm_partition_update(pTVar11 + blk_row,pTVar10 + depth,TVar14,txb_size);
  return;
}

Assistant:

static void update_txfm_count(MACROBLOCK *x, MACROBLOCKD *xd,
                              FRAME_COUNTS *counts, TX_SIZE tx_size, int depth,
                              int blk_row, int blk_col,
                              uint8_t allow_update_cdf) {
  MB_MODE_INFO *mbmi = xd->mi[0];
  const BLOCK_SIZE bsize = mbmi->bsize;
  const int max_blocks_high = max_block_high(xd, bsize, 0);
  const int max_blocks_wide = max_block_wide(xd, bsize, 0);
  int ctx = txfm_partition_context(xd->above_txfm_context + blk_col,
                                   xd->left_txfm_context + blk_row, mbmi->bsize,
                                   tx_size);
  const int txb_size_index = av1_get_txb_size_index(bsize, blk_row, blk_col);
  const TX_SIZE plane_tx_size = mbmi->inter_tx_size[txb_size_index];

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;
  assert(tx_size > TX_4X4);

  if (depth == MAX_VARTX_DEPTH) {
    // Don't add to counts in this case
    mbmi->tx_size = tx_size;
    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);
    return;
  }

  if (tx_size == plane_tx_size) {
#if CONFIG_ENTROPY_STATS
    ++counts->txfm_partition[ctx][0];
#endif
    if (allow_update_cdf)
      update_cdf(xd->tile_ctx->txfm_partition_cdf[ctx], 0, 2);
    mbmi->tx_size = tx_size;
    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);
  } else {
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];

#if CONFIG_ENTROPY_STATS
    ++counts->txfm_partition[ctx][1];
#endif
    if (allow_update_cdf)
      update_cdf(xd->tile_ctx->txfm_partition_cdf[ctx], 1, 2);
    ++x->txfm_search_info.txb_split_count;

    if (sub_txs == TX_4X4) {
      mbmi->inter_tx_size[txb_size_index] = TX_4X4;
      mbmi->tx_size = TX_4X4;
      txfm_partition_update(xd->above_txfm_context + blk_col,
                            xd->left_txfm_context + blk_row, TX_4X4, tx_size);
      return;
    }

    for (int row = 0; row < tx_size_high_unit[tx_size]; row += bsh) {
      for (int col = 0; col < tx_size_wide_unit[tx_size]; col += bsw) {
        int offsetr = row;
        int offsetc = col;

        update_txfm_count(x, xd, counts, sub_txs, depth + 1, blk_row + offsetr,
                          blk_col + offsetc, allow_update_cdf);
      }
    }
  }
}